

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int areBlanks(xmlParserCtxtPtr ctxt,xmlChar *str,int len,int blank_chars)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  xmlNode *node;
  int iVar3;
  xmlNodePtr node_00;
  ulong uVar4;
  
  if (ctxt->sax->ignorableWhitespace == ctxt->sax->characters) {
    return 0;
  }
  if (ctxt->space == (int *)0x0) {
    return 0;
  }
  iVar3 = *ctxt->space;
  if (iVar3 == -2) {
    return 0;
  }
  if (iVar3 == 1) {
    return 0;
  }
  if (0 < len && blank_chars == 0) {
    uVar4 = 0;
    do {
      if ((0x20 < (ulong)str[uVar4]) || ((0x100002600U >> ((ulong)str[uVar4] & 0x3f) & 1) == 0)) {
        return 0;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)len != uVar4);
  }
  if (ctxt->node == (xmlNodePtr)0x0) {
    return 0;
  }
  if (ctxt->myDoc != (xmlDocPtr)0x0) {
    iVar3 = xmlIsMixedElement(ctxt->myDoc,ctxt->node->name);
    if (iVar3 == 0) {
      return 1;
    }
    if (iVar3 == 1) {
      return 0;
    }
  }
  pxVar2 = ctxt->input->cur;
  xVar1 = *pxVar2;
  if ((xVar1 != '<') && (xVar1 != '\r')) {
    return 0;
  }
  if (((xVar1 == '<') && (ctxt->node->children == (_xmlNode *)0x0)) && (pxVar2[1] == '/')) {
    return 0;
  }
  node_00 = xmlGetLastChild(ctxt->node);
  if (node_00 == (xmlNodePtr)0x0) {
    if ((ctxt->node->type != XML_ELEMENT_NODE) && (ctxt->node->content != (xmlChar *)0x0)) {
      return 0;
    }
  }
  else {
    iVar3 = xmlNodeIsText(node_00);
    if (iVar3 != 0) {
      return 0;
    }
    node = ctxt->node->children;
    if ((node != (xmlNode *)0x0) && (iVar3 = xmlNodeIsText(node), iVar3 != 0)) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int areBlanks(xmlParserCtxtPtr ctxt, const xmlChar *str, int len,
                     int blank_chars) {
    int i, ret;
    xmlNodePtr lastChild;

    /*
     * Don't spend time trying to differentiate them, the same callback is
     * used !
     */
    if (ctxt->sax->ignorableWhitespace == ctxt->sax->characters)
	return(0);

    /*
     * Check for xml:space value.
     */
    if ((ctxt->space == NULL) || (*(ctxt->space) == 1) ||
        (*(ctxt->space) == -2))
	return(0);

    /*
     * Check that the string is made of blanks
     */
    if (blank_chars == 0) {
	for (i = 0;i < len;i++)
	    if (!(IS_BLANK_CH(str[i]))) return(0);
    }

    /*
     * Look if the element is mixed content in the DTD if available
     */
    if (ctxt->node == NULL) return(0);
    if (ctxt->myDoc != NULL) {
	ret = xmlIsMixedElement(ctxt->myDoc, ctxt->node->name);
        if (ret == 0) return(1);
        if (ret == 1) return(0);
    }

    /*
     * Otherwise, heuristic :-\
     */
    if ((RAW != '<') && (RAW != 0xD)) return(0);
    if ((ctxt->node->children == NULL) &&
	(RAW == '<') && (NXT(1) == '/')) return(0);

    lastChild = xmlGetLastChild(ctxt->node);
    if (lastChild == NULL) {
        if ((ctxt->node->type != XML_ELEMENT_NODE) &&
            (ctxt->node->content != NULL)) return(0);
    } else if (xmlNodeIsText(lastChild))
        return(0);
    else if ((ctxt->node->children != NULL) &&
             (xmlNodeIsText(ctxt->node->children)))
        return(0);
    return(1);
}